

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

uint16_t brotli::CombineLengthCodes(uint16_t inscode,uint16_t copycode,bool use_last_distance)

{
  ushort uVar1;
  
  uVar1 = (copycode & 7) + (inscode & 7) * 8;
  if (copycode < 0x10 && (inscode < 8 && use_last_distance)) {
    if (7 < copycode) {
      uVar1 = uVar1 | 0x40;
    }
    return uVar1;
  }
  return uVar1 | CombineLengthCodes::cells[(uint)(inscode >> 3) * 3 + (uint)(copycode >> 3)];
}

Assistant:

static inline uint16_t CombineLengthCodes(
    uint16_t inscode, uint16_t copycode, bool use_last_distance) {
  uint16_t bits64 =
      static_cast<uint16_t>((copycode & 0x7u) | ((inscode & 0x7u) << 3));
  if (use_last_distance && inscode < 8 && copycode < 16) {
    return (copycode < 8) ? bits64 : (bits64 | 64);
  } else {
    // "To convert an insert-and-copy length code to an insert length code and
    // a copy length code, the following table can be used"
    static const uint16_t cells[9] = { 128u, 192u, 384u, 256u, 320u, 512u,
                                       448u, 576u, 640u };
    return cells[(copycode >> 3) + 3 * (inscode >> 3)] | bits64;
  }
}